

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Serializer.hpp
# Opt level: O3

void mserialize::detail::
     BuiltinSerializer<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_void>
     ::serialize<OutputStream>
               (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                *s,OutputStream *ostream)

{
  pointer pvVar1;
  vector<int,_std::allocator<int>_> *elem;
  pointer s_00;
  int local_1c;
  
  local_1c = (int)((ulong)((long)(s->
                                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                 )._M_impl.super__Vector_impl_data._M_finish -
                          (long)(s->
                                super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x55555555;
  std::ostream::write((char *)(ostream->stream + 0x10),(long)&local_1c);
  pvVar1 = (s->
           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (s_00 = (s->
              super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start; s_00 != pvVar1; s_00 = s_00 + 1) {
    BuiltinSerializer<std::vector<int,_std::allocator<int>_>,_void>::serialize<OutputStream>
              (s_00,ostream);
  }
  return;
}

Assistant:

static void serialize(const Sequence& s, OutputStream& ostream)
  {
    const auto size = sequence_size(s);
    const auto size32 = std::uint32_t(size);
    assert(size32 == size && "sequence size must fit on 32 bits");

    mserialize::serialize(size32, ostream);
    serialize_elems(is_sequence_batch_serializable<const Sequence>{}, s, size32, ostream);
  }